

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O1

void __thiscall Diligent::VAOCache::VAOCache(VAOCache *this)

{
  (this->m_CacheLock).m_IsLocked._M_base._M_i = false;
  (this->m_Cache)._M_h._M_buckets = &(this->m_Cache)._M_h._M_single_bucket;
  (this->m_Cache)._M_h._M_bucket_count = 1;
  (this->m_Cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_Cache)._M_h._M_element_count = 0;
  (this->m_Cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_Cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_Cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_PSOToKey)._M_h._M_buckets = &(this->m_PSOToKey)._M_h._M_single_bucket;
  (this->m_PSOToKey)._M_h._M_bucket_count = 1;
  (this->m_PSOToKey)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_PSOToKey)._M_h._M_element_count = 0;
  (this->m_PSOToKey)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_PSOToKey)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_PSOToKey)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_BuffToKey)._M_h._M_buckets = &(this->m_BuffToKey)._M_h._M_single_bucket;
  (this->m_BuffToKey)._M_h._M_bucket_count = 1;
  (this->m_BuffToKey)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_BuffToKey)._M_h._M_element_count = 0;
  (this->m_BuffToKey)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_BuffToKey)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_BuffToKey)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>::GLObjWrapper
            (&this->m_EmptyVAO,1);
  (this->m_Cache)._M_h._M_rehash_policy._M_max_load_factor = 0.5;
  (this->m_Cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_PSOToKey)._M_h._M_rehash_policy._M_max_load_factor = 0.5;
  (this->m_PSOToKey)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_BuffToKey)._M_h._M_rehash_policy._M_max_load_factor = 0.5;
  (this->m_BuffToKey)._M_h._M_rehash_policy._M_next_resize = 0;
  return;
}

Assistant:

VAOCache::VAOCache() :
    m_EmptyVAO{true}
{
    m_Cache.max_load_factor(0.5f);
    m_PSOToKey.max_load_factor(0.5f);
    m_BuffToKey.max_load_factor(0.5f);
}